

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list2cpp.cpp
# Opt level: O3

void __thiscall lst::OutputList::outputToFileAsChar(OutputList *this,ostream *file,string *varname)

{
  pointer pbVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>(file,"inline constexpr unsigned long ",0x1f);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (file,(varname->_M_dataplus)._M_p,varname->_M_string_length);
  lVar3 = 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_size = ",8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(file,"\ninline const char *",0x14);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (file,(varname->_M_dataplus)._M_p,varname->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_arr[",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(varname->_M_dataplus)._M_p,varname->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_size] = {\n",0xb);
  lVar6 = (long)(this->items).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->items).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    uVar7 = lVar6 >> 5;
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(file,"\"",1);
      pbVar1 = (this->items).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (file,*(char **)((long)pbVar1 + lVar3 + -8),
                          *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
      if (uVar7 - 2 < uVar5) {
        lVar6 = 5;
        pcVar4 = "\"\n};\n";
      }
      else {
        lVar6 = 3;
        pcVar4 = "\",\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar6);
      uVar5 = uVar5 + 1;
      uVar7 = (long)(this->items).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->items).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar3 = lVar3 + 0x20;
    } while (uVar5 < uVar7);
  }
  return;
}

Assistant:

void OutputList::outputToFileAsChar(std::ostream &file, std::string varname) {
        file << "inline constexpr unsigned long " << varname << "_size = " << size() << ";\n";
        file << "\ninline const char *" << varname << "_arr[" << varname << "_size] = {\n";
        for(std::size_t i = 0; i < size(); ++i) {
            if(i > size()-2) {
                file << "\"" << items[i] << "\"\n};\n";
            } else {
                file << "\"" << items[i] << "\",\n";
            }
        }
    }